

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O0

string * cppcms::filters::streamable::
         to_string<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
                   (ios *out,void *ptr)

{
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> *in_RDI;
  ostringstream oss;
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> *object;
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> *out_00;
  long local_198 [51];
  
  out_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  cppcms::operator<<((ostream *)out_00,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return (string *)out_00;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}